

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Ptr_AbcDeriveBoxes(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  uVar5 = pNtk->nObjCounts[7] + pNtk->vBoxes->nSize;
  if ((int)uVar5 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((ulong)uVar5 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pVVar4 = Ptr_AbcDeriveBox((Abc_Obj_t *)pVVar4->pArray[lVar7]);
      uVar5 = pVVar2->nSize;
      uVar1 = pVVar2->nCap;
      if (uVar5 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar1 * 2;
          if (iVar6 <= (int)uVar1) goto LAB_00392380;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = iVar6;
      }
LAB_00392380:
      pVVar2->nSize = uVar5 + 1;
      pVVar2->pArray[(int)uVar5] = pVVar4;
      lVar7 = lVar7 + 1;
      pVVar4 = pNtk->vBoxes;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar4->pArray[lVar7];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        pVVar4 = Ptr_AbcDeriveNode(pObj);
        uVar5 = pVVar2->nSize;
        uVar1 = pVVar2->nCap;
        if (uVar5 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar1 * 2;
            if (iVar6 <= (int)uVar1) goto LAB_0039243d;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
            }
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar6;
        }
LAB_0039243d:
        pVVar2->nSize = uVar5 + 1;
        pVVar2->pArray[(int)uVar5] = pVVar4;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar7 < pVVar4->nSize);
  }
  if (pVVar2->nSize != pVVar2->nCap) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Abc_NtkBoxNum(pNtk) + Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveBox(pObj) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveNode(pObj) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}